

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

int ratelimit_connects(uint *last,uint secs)

{
  bool bVar1;
  undefined1 local_30 [8];
  timeval tv;
  uint secs_local;
  uint *last_local;
  
  tv.tv_usec._4_4_ = secs;
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  bVar1 = (long)(ulong)tv.tv_usec._4_4_ <= (long)((long)local_30 - (ulong)*last);
  if (bVar1) {
    *last = local_30._0_4_;
  }
  last_local._4_4_ = (uint)bVar1;
  return last_local._4_4_;
}

Assistant:

static int ratelimit_connects(unsigned int *last, unsigned int secs)
{
	struct timeval tv;

	gettimeofday(&tv, NULL);

	if (tv.tv_sec - (*last) < secs)
		return 0;

	*last = tv.tv_sec;

	return 1;
}